

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O0

int __thiscall
LASreadItemCompressed_RGB14_v3::init(LASreadItemCompressed_RGB14_v3 *this,EVP_PKEY_CTX *ctx)

{
  BOOL BVar1;
  ByteStreamIn *pBVar2;
  ByteStreamInArrayLE *this_00;
  ByteStreamInArrayBE *this_01;
  ArithmeticDecoder *this_02;
  U8 *pUVar3;
  uint7 extraout_var;
  U32 *in_RDX;
  uint local_40;
  U32 c;
  ByteStreamIn *instream;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_RGB14_v3 *this_local;
  
  pBVar2 = ArithmeticDecoder::getByteStreamIn(this->dec);
  if (this->instream_RGB == (ByteStreamInArray *)0x0) {
    BVar1 = IS_LITTLE_ENDIAN();
    if (BVar1) {
      this_00 = (ByteStreamInArrayLE *)operator_new(0x38);
      ByteStreamInArrayLE::ByteStreamInArrayLE(this_00);
      this->instream_RGB = (ByteStreamInArray *)this_00;
    }
    else {
      this_01 = (ByteStreamInArrayBE *)operator_new(0x38);
      ByteStreamInArrayBE::ByteStreamInArrayBE(this_01);
      this->instream_RGB = (ByteStreamInArray *)this_01;
    }
    this_02 = (ArithmeticDecoder *)operator_new(0x10);
    ArithmeticDecoder::ArithmeticDecoder(this_02);
    this->dec_RGB = this_02;
  }
  if (this->num_bytes_allocated < this->num_bytes_RGB) {
    if ((this->bytes != (U8 *)0x0) && (this->bytes != (U8 *)0x0)) {
      operator_delete__(this->bytes);
    }
    pUVar3 = (U8 *)operator_new__((ulong)this->num_bytes_RGB);
    this->bytes = pUVar3;
    if (this->bytes == (U8 *)0x0) {
      this_local._7_1_ = 0;
      goto LAB_00153ee0;
    }
    this->num_bytes_allocated = this->num_bytes_RGB;
  }
  if ((this->requested_RGB & 1U) == 0) {
    if (this->num_bytes_RGB != 0) {
      (*pBVar2->_vptr_ByteStreamIn[0xc])(pBVar2,(ulong)this->num_bytes_RGB);
    }
    this->changed_RGB = false;
  }
  else if (this->num_bytes_RGB == 0) {
    ByteStreamInArray::init(this->instream_RGB,(EVP_PKEY_CTX *)0x0);
    this->changed_RGB = false;
  }
  else {
    (*pBVar2->_vptr_ByteStreamIn[1])(pBVar2,this->bytes,(ulong)this->num_bytes_RGB);
    ByteStreamInArray::init(this->instream_RGB,(EVP_PKEY_CTX *)this->bytes);
    ArithmeticDecoder::init(this->dec_RGB,(EVP_PKEY_CTX *)this->instream_RGB);
    this->changed_RGB = true;
  }
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    this->contexts[local_40].unused = true;
  }
  this->current_context = *in_RDX;
  createAndInitModelsAndDecompressors(this,this->current_context,(U8 *)ctx);
  this = (LASreadItemCompressed_RGB14_v3 *)((ulong)extraout_var << 8);
  this_local._7_1_ = 1;
LAB_00153ee0:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

BOOL LASreadItemCompressed_RGB14_v3::init(const U8* item, U32& context)
{
  /* for layered compression 'dec' only hands over the stream */

  ByteStreamIn* instream = dec->getByteStreamIn();

  /* on the first init create instreams and decoders */

  if (instream_RGB == 0)
  {
    /* create instreams */

    if (IS_LITTLE_ENDIAN())
    {
      instream_RGB = new ByteStreamInArrayLE();
    }
    else
    {
      instream_RGB = new ByteStreamInArrayBE();
    }

    /* create decoders */

    dec_RGB = new ArithmeticDecoder();
  }
  
  /* make sure the buffer is sufficiently large */

  if (num_bytes_RGB > num_bytes_allocated)
  {
    if (bytes) delete [] bytes;
    bytes = new U8[num_bytes_RGB];
    if (bytes == 0) return FALSE;
    num_bytes_allocated = num_bytes_RGB;
  }

  /* load the requested bytes and init the corresponding instreams an decoders */

  if (requested_RGB)
  {
    if (num_bytes_RGB)
    {
      instream->getBytes(bytes, num_bytes_RGB);
      instream_RGB->init(bytes, num_bytes_RGB);
      dec_RGB->init(instream_RGB);
      changed_RGB = TRUE;
    }
    else
    {
      instream_RGB->init(0, 0);
      changed_RGB = FALSE;
    }
  }
  else
  {
    if (num_bytes_RGB)
    {
      instream->skipBytes(num_bytes_RGB);
    }
    changed_RGB = FALSE;
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 reader

  /* create and init models and decompressors */

  createAndInitModelsAndDecompressors(current_context, item);

  return TRUE;
}